

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

void duckdb::HandleCollations
               (ClientContext *context,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *children)

{
  char cVar1;
  InternalException *this;
  long in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000010;
  ScalarFunction *in_stack_00000018;
  ClientContext *in_stack_00000020;
  CollationType in_stack_0000006c;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000070;
  ScalarFunction *in_stack_00000078;
  ClientContext *in_stack_00000080;
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [56];
  
  cVar1 = *(char *)(in_RSI + 0xab);
  if (cVar1 == '\0') {
    PropagateCollations(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  else if (cVar1 == '\x01') {
    PushCollations(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  }
  else if (cVar1 != '\x02') {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Unrecognized collation handling",&local_39);
    InternalException::InternalException(this,in_stack_ffffffffffffff98);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

void HandleCollations(ClientContext &context, ScalarFunction &bound_function,
                      vector<unique_ptr<Expression>> &children) {
	switch (bound_function.collation_handling) {
	case FunctionCollationHandling::IGNORE_COLLATIONS:
		// explicitly ignoring collation handling
		break;
	case FunctionCollationHandling::PROPAGATE_COLLATIONS:
		PropagateCollations(context, bound_function, children);
		break;
	case FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS:
		// first propagate, then push collations to the children
		PushCollations(context, bound_function, children, CollationType::COMBINABLE_COLLATIONS);
		break;
	default:
		throw InternalException("Unrecognized collation handling");
	}
}